

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_storage.cpp
# Opt level: O1

pair<XmlRpc::XmlRpcValue_*,_XmlRpc::XmlRpcValue_*> __thiscall
miniros::master::ParameterStorage::findParameter(ParameterStorage *this,Path *name,bool create)

{
  bool bVar1;
  size_t sVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  XmlRpcValue *pXVar5;
  size_t sVar6;
  pair<XmlRpc::XmlRpcValue_*,_XmlRpc::XmlRpcValue_*> pVar7;
  string key;
  string local_60;
  XmlRpcValue local_40;
  
  sVar2 = names::Path::size(name);
  if (sVar2 == 0) {
    pXVar5 = (XmlRpcValue *)0x0;
    pmVar4 = (mapped_type *)0x0;
  }
  else {
    pmVar3 = &this->m_parameterRoot;
    sVar2 = names::Path::size(name);
    sVar6 = 0;
    if (sVar2 == 0) {
      pXVar5 = (XmlRpcValue *)0x0;
    }
    else {
      pXVar5 = (XmlRpcValue *)0x0;
      pmVar4 = pmVar3;
      do {
        names::Path::str_abi_cxx11_(&local_60,name,(int)sVar6);
        bVar1 = XmlRpc::XmlRpcValue::hasMember(pmVar4,&local_60);
        if (bVar1) {
          XmlRpc::XmlRpcValue::assertStruct(pmVar4);
          pmVar3 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                                 *)(pmVar4->_value).asTime,&local_60);
LAB_00241e20:
          bVar1 = true;
          pXVar5 = pmVar4;
        }
        else {
          if (create) {
            if (pmVar4->_type != TypeStruct) {
              XmlRpc::XmlRpcValue::Dict();
              XmlRpc::XmlRpcValue::operator=(pmVar4,&local_40);
              XmlRpc::XmlRpcValue::invalidate(&local_40);
            }
            XmlRpc::XmlRpcValue::Dict();
            XmlRpc::XmlRpcValue::assertStruct(pmVar4);
            pmVar3 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                                   *)(pmVar4->_value).asTime,&local_60);
            XmlRpc::XmlRpcValue::operator=(pmVar3,&local_40);
            XmlRpc::XmlRpcValue::invalidate(&local_40);
            XmlRpc::XmlRpcValue::assertStruct(pmVar4);
            pmVar3 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                                   *)(pmVar4->_value).asTime,&local_60);
            goto LAB_00241e20;
          }
          bVar1 = false;
          pmVar3 = pmVar4;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if (!bVar1) break;
        sVar6 = sVar6 + 1;
        sVar2 = names::Path::size(name);
        pmVar4 = pmVar3;
      } while (sVar6 < sVar2);
    }
    sVar2 = names::Path::size(name);
    pmVar4 = (mapped_type *)0x0;
    if (sVar6 == sVar2) {
      pmVar4 = pmVar3;
    }
  }
  pVar7.second = pXVar5;
  pVar7.first = pmVar4;
  return pVar7;
}

Assistant:

std::pair<ParameterStorage::RpcValue*, ParameterStorage::RpcValue*> ParameterStorage::findParameter(const names::Path& name, bool create) const
{
  if (name.size() == 0)
    return {};

  RpcValue* current = const_cast<RpcValue*>(&m_parameterRoot);
  RpcValue* parent = nullptr;

  size_t i = 0;
  for (; i < name.size(); i++) {
    std::string key = name.str(i);
    if (current->hasMember(key)) {
      RpcValue* next = &(*current)[key];
      parent = current;
      current = next;
    }
    else if (create) {
      if (current->getType() != RpcValue::TypeStruct)
        *current = RpcValue::Dict();
      // New value. We are making it dict by default.
      // It is ok for final new value to be dict: setParam will override it anyway.
      (*current)[key] = RpcValue::Dict();
      RpcValue* next = &(*current)[key];

      parent = current;
      current = next;
    } else
      break;
  }

  if (i == name.size()) {
    // current contains a pointer to the needed element.
    return {current, parent};
  }
  return {nullptr, parent};
}